

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O3

void __thiscall
writer_test_should_write_nested_repeating_groups_Test::
~writer_test_should_write_nested_repeating_groups_Test
          (writer_test_should_write_nested_repeating_groups_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(writer_test, should_write_nested_repeating_groups)
{
    Fixpp::v44::Message::MarketDataSnapshot snapshot;
    Fixpp::set<Fixpp::Tag::MDReqID>(snapshot, "1709");
    Fixpp::set<Fixpp::Tag::Symbol>(snapshot, "AUD/CAD");

    auto underlyingGroups = Fixpp::createGroup<Fixpp::Tag::NoUnderlyings>(snapshot, 1);
    auto underlying0 = underlyingGroups.instance();

    Fixpp::set<Fixpp::Tag::UnderlyingProduct>(underlying0, 1);
    auto underlyingSecurityAltIDs = Fixpp::createGroup<Fixpp::Tag::NoUnderlyingSecurityAltID>(underlying0, 1);
    auto underlyingSecurityAltID0 = underlyingSecurityAltIDs.instance();

    Fixpp::set<Fixpp::Tag::UnderlyingSecurityAltID>(underlyingSecurityAltID0, "TESTID");
    Fixpp::set<Fixpp::Tag::UnderlyingSecurityAltIDSource>(underlyingSecurityAltID0, "TESTSOURCE");
    underlyingSecurityAltIDs.add(underlyingSecurityAltID0);
    Fixpp::set<Fixpp::Tag::UnderlyingSymbol>(underlying0, "AUD/CAD");

    underlyingGroups.add(underlying0);

    Fixpp::set<Fixpp::Tag::CorporateAction>(snapshot, 'D');

    std::tm entryDateTm{};
    entryDateTm.tm_year = 117; // 2017
    entryDateTm.tm_mon = 4;    // May
    entryDateTm.tm_mday = 16;
    Fixpp::Type::UTCDate::Date entryDate{mkgmtime(&entryDateTm)};

    std::tm entryTimeTm{};
    entryTimeTm.tm_hour = 15;
    entryTimeTm.tm_min = 10;
    entryTimeTm.tm_sec = 5;
    Fixpp::Type::UTCTimeOnly::Time entryTime{mkgmtime(&entryTimeTm), 100};

    auto mdEntries = Fixpp::createGroup<Fixpp::Tag::NoMDEntries>(snapshot, 2);
    auto mdEntry0 = mdEntries.instance();
    Fixpp::set<Fixpp::Tag::MDEntryType>(mdEntry0, '0');
    Fixpp::set<Fixpp::Tag::MDEntrySize>(mdEntry0, 500000.0);
    Fixpp::set<Fixpp::Tag::MDEntryDate>(mdEntry0, entryDate);
    Fixpp::set<Fixpp::Tag::MDEntryTime>(mdEntry0, entryTime);
    Fixpp::set<Fixpp::Tag::QuoteEntryID>(mdEntry0, "02z00000hdi:A");
    mdEntries.add(mdEntry0);

    auto mdEntry1 = mdEntries.instance();
    Fixpp::set<Fixpp::Tag::MDEntryType>(mdEntry1, '1');
    Fixpp::set<Fixpp::Tag::MDEntrySize>(mdEntry1, 500000.0);
    Fixpp::set<Fixpp::Tag::MDEntryDate>(mdEntry1, entryDate);
    Fixpp::set<Fixpp::Tag::MDEntryTime>(mdEntry0, entryTime);
    Fixpp::set<Fixpp::Tag::QuoteEntryID>(mdEntry1, "02z00000hdi:A");
    mdEntries.add(mdEntry1);

    auto header = createHeader<Fixpp::v44::Header>();

    Fixpp::Writer writer;
    std::cout << writer.write(header, snapshot) << std::endl;
}